

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,wchar_t **it)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  wchar_t *pwVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  char acStack_d [13];
  
  iVar1 = *(int *)(this + 4);
  lVar3 = (long)iVar1;
  if (lVar3 < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = wchar_t, UInt = unsigned int, Iterator = wchar_t *, ThousandsSep = fmt::internal::no_thousands_sep]"
                 );
  }
  uVar5 = *(uint *)this;
  pcVar4 = acStack_d + lVar3;
  uVar8 = uVar5;
  if (99 < uVar5) {
    do {
      uVar8 = uVar5 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar5 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar2 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar2);
  }
  pwVar6 = *it;
  if (uVar8 < 10) {
    bVar7 = (byte)uVar8 | 0x30;
    lVar9 = -1;
  }
  else {
    pcVar4[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar8 * 2 & 0xffffffff) + 1];
    bVar7 = internal::basic_data<void>::DIGITS[(ulong)uVar8 * 2];
    lVar9 = -2;
  }
  pcVar4[lVar9] = bVar7;
  if (iVar1 != 0) {
    lVar9 = 0;
    do {
      *pwVar6 = (int)acStack_d[lVar9];
      pwVar6 = pwVar6 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar3 != lVar9);
  }
  *it = pwVar6;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }